

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O1

int yang_fill_type(lys_module *module,lys_type *type,yang_type *stype,void *parent,
                  unres_schema *unres)

{
  uint uVar1;
  lys_type_bit *plVar2;
  lys_tpdf *plVar3;
  char *expr;
  lys_restr *plVar4;
  lys_node_leaf *plVar5;
  int iVar6;
  char *str;
  long lVar7;
  long lVar8;
  ulong uVar9;
  bool bVar10;
  int local_3c;
  
  type->parent = (lys_tpdf *)parent;
  iVar6 = yang_check_ext_instance(module,&type->ext,(uint)type->ext_size,type,unres);
  local_3c = 1;
  if (iVar6 == 0) {
    switch(stype->base) {
    case LY_TYPE_BITS:
      if (0 < (type->info).bits.count) {
        lVar7 = 0;
        lVar8 = 0;
        do {
          iVar6 = yang_check_iffeatures
                            (module,(void *)((long)&((type->info).bits.bit)->name + lVar7),parent,
                             BIT_KEYWORD,unres);
          if (iVar6 != 0) {
            return 1;
          }
          plVar2 = (type->info).bits.bit;
          iVar6 = yang_check_ext_instance
                            (module,(lys_ext_instance ***)((long)&plVar2->ext + lVar7),
                             (uint)(&plVar2->ext_size)[lVar7],(void *)((long)&plVar2->name + lVar7),
                             unres);
          if (iVar6 != 0) {
            return 1;
          }
          lVar8 = lVar8 + 1;
          lVar7 = lVar7 + 0x30;
        } while (lVar8 < (type->info).bits.count);
      }
      break;
    case LY_TYPE_DEC64:
      plVar4 = (type->info).dec64.range;
      if ((plVar4 != (lys_restr *)0x0) &&
         (iVar6 = yang_check_ext_instance(module,&plVar4->ext,(uint)plVar4->ext_size,plVar4,unres),
         iVar6 != 0)) {
        return 1;
      }
      break;
    case LY_TYPE_ENUM:
      if (0 < (type->info).bits.count) {
        lVar7 = 0;
        lVar8 = 0;
        do {
          iVar6 = yang_check_iffeatures
                            (module,(void *)((long)&((type->info).bits.bit)->name + lVar7),parent,
                             ENUM_KEYWORD,unres);
          if (iVar6 != 0) {
            return 1;
          }
          plVar2 = (type->info).bits.bit;
          iVar6 = yang_check_ext_instance
                            (module,(lys_ext_instance ***)((long)&plVar2->ext + lVar7),
                             (uint)(&plVar2->ext_size)[lVar7],(void *)((long)&plVar2->name + lVar7),
                             unres);
          if (iVar6 != 0) {
            return 1;
          }
          lVar8 = lVar8 + 1;
          lVar7 = lVar7 + 0x30;
        } while (lVar8 < (type->info).bits.count);
      }
      break;
    case LY_TYPE_IDENT:
      plVar3 = type->der;
      plVar2 = (type->info).bits.bit;
      uVar1 = (type->info).bits.count;
      (type->info).bits.count = 0;
      (type->info).bits.bit = (lys_type_bit *)0x0;
      *(byte *)&plVar3->name = *(byte *)&plVar3->name | 0x20;
      if ((ulong)uVar1 != 0) {
        uVar9 = 1;
        do {
          expr = *(char **)((long)plVar2 + uVar9 * 8 + -8);
          str = transform_schema2json(module,expr);
          free(expr);
          if (str == (char *)0x0) {
LAB_001530c2:
            if ((uint)uVar9 < uVar1) {
              do {
                free((&plVar2->name)[uVar9]);
                uVar9 = uVar9 + 1;
              } while (uVar1 != (uint)uVar9);
            }
            free(plVar2);
            return 1;
          }
          iVar6 = unres_schema_add_str(module,unres,type,UNRES_TYPE_IDENTREF,str);
          lydict_remove(module->ctx,str);
          if (iVar6 == -1) goto LAB_001530c2;
          bVar10 = uVar9 != uVar1;
          uVar9 = uVar9 + 1;
        } while (bVar10);
      }
      free(plVar2);
      break;
    case LY_TYPE_STRING:
      plVar4 = (type->info).dec64.range;
      if ((plVar4 != (lys_restr *)0x0) &&
         (iVar6 = yang_check_ext_instance(module,&plVar4->ext,(uint)plVar4->ext_size,plVar4,unres),
         iVar6 != 0)) {
        return 1;
      }
      if (0 < (type->info).str.pat_count) {
        lVar7 = 0x28;
        lVar8 = 0;
        do {
          plVar5 = (type->info).lref.target;
          iVar6 = yang_check_ext_instance
                            (module,(lys_ext_instance ***)(plVar5->padding + lVar7 + -0x1c),
                             (uint)plVar5->padding[lVar7 + -0x14],plVar5->padding + lVar7 + -0x44,
                             unres);
          if (iVar6 != 0) {
            return 1;
          }
          lVar8 = lVar8 + 1;
          lVar7 = lVar7 + 0x38;
        } while (lVar8 < (type->info).str.pat_count);
      }
      break;
    case LY_TYPE_UNION:
      if (0 < (type->info).bits.count) {
        lVar7 = 0;
        lVar8 = 0;
        do {
          plVar2 = (type->info).bits.bit;
          iVar6 = yang_fill_type(module,(lys_type *)((long)&plVar2->name + lVar7),
                                 *(yang_type **)((long)&plVar2->flags + lVar7),parent,unres);
          if (iVar6 != 0) {
            return 1;
          }
          lVar8 = lVar8 + 1;
          lVar7 = lVar7 + 0x40;
        } while (lVar8 < (type->info).bits.count);
      }
    }
    local_3c = 0;
  }
  return local_3c;
}

Assistant:

int
yang_fill_type(struct lys_module *module, struct lys_type *type, struct yang_type *stype,
               void *parent, struct unres_schema *unres)
{
    int i;

    type->parent = parent;
    if (yang_check_ext_instance(module, &type->ext, type->ext_size, type, unres)) {
        return EXIT_FAILURE;
    }
    switch (stype->base) {
    case LY_TYPE_ENUM:
        for (i = 0; i < type->info.enums.count; ++i) {
            if (yang_check_iffeatures(module, &type->info.enums.enm[i], parent, ENUM_KEYWORD, unres)) {
                return EXIT_FAILURE;
            }
            if (yang_check_ext_instance(module, &type->info.enums.enm[i].ext, type->info.enums.enm[i].ext_size,
                                        &type->info.enums.enm[i], unres)) {
                return EXIT_FAILURE;
            }
        }
        break;
    case LY_TYPE_BITS:
        for (i = 0; i < type->info.bits.count; ++i) {
            if (yang_check_iffeatures(module, &type->info.bits.bit[i], parent, BIT_KEYWORD, unres)) {
                return EXIT_FAILURE;
            }
            if (yang_check_ext_instance(module, &type->info.bits.bit[i].ext, type->info.bits.bit[i].ext_size,
                                        &type->info.bits.bit[i], unres)) {
                return EXIT_FAILURE;
            }
        }
        break;
    case LY_TYPE_IDENT:
        if (yang_check_identityref(module, type, unres)) {
            return EXIT_FAILURE;
        }
        break;
    case LY_TYPE_STRING:
        if (type->info.str.length && yang_check_ext_instance(module, &type->info.str.length->ext,
                                                             type->info.str.length->ext_size, type->info.str.length, unres)) {
            return EXIT_FAILURE;
        }
        for (i = 0; i < type->info.str.pat_count; ++i) {
            if (yang_check_ext_instance(module, &type->info.str.patterns[i].ext, type->info.str.patterns[i].ext_size,
                                        &type->info.str.patterns[i], unres)) {
                return EXIT_FAILURE;
            }
        }
        break;
    case LY_TYPE_DEC64:
        if (type->info.dec64.range && yang_check_ext_instance(module, &type->info.dec64.range->ext,
                                                             type->info.dec64.range->ext_size, type->info.dec64.range, unres)) {
            return EXIT_FAILURE;
        }
        break;
    case LY_TYPE_UNION:
        for (i = 0; i < type->info.uni.count; ++i) {
            if (yang_fill_type(module, &type->info.uni.types[i], (struct yang_type *)type->info.uni.types[i].der,
                               parent, unres)) {
                return EXIT_FAILURE;
            }
        }
        break;
    default:
        /* nothing checks */
        break;
    }
    return EXIT_SUCCESS;
}